

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.h
# Opt level: O0

size_type google::protobuf::stringpiece_internal::StringPiece::CheckSize(size_type size)

{
  size_type size_local;
  
  if (0x7fffffffffffffff < size) {
    LogFatalSizeTooBig(size,"string length exceeds max size");
  }
  return size;
}

Assistant:

static size_type CheckSize(size_type size) {
#if !defined(NDEBUG) || defined(_FORTIFY_SOURCE) && _FORTIFY_SOURCE > 0
    if (PROTOBUF_PREDICT_FALSE(size > kMaxSize)) {
      // Some people grep for this message in logs
      // so take care if you ever change it.
      LogFatalSizeTooBig(size, "string length exceeds max size");
    }
#endif
    return size;
  }